

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QKeyCombination>::emplace<QKeyCombination_const&>
          (QMovableArrayOps<QKeyCombination> *this,qsizetype i,QKeyCombination *args)

{
  qsizetype *pqVar1;
  int iVar2;
  Data *pDVar3;
  long lVar4;
  QKeyCombination *pQVar5;
  bool bVar6;
  
  pDVar3 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
           d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    lVar4 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>
            .size;
    if ((lVar4 == i) &&
       (pQVar5 = (this->super_QGenericArrayOps<QKeyCombination>).
                 super_QArrayDataPointer<QKeyCombination>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar5 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
       i)) {
      pQVar5[i].combination = args->combination;
      goto LAB_0040df38;
    }
    if ((i == 0) &&
       (pQVar5 = (this->super_QGenericArrayOps<QKeyCombination>).
                 super_QArrayDataPointer<QKeyCombination>.ptr,
       (QKeyCombination *)
       ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) != pQVar5)) {
      pQVar5[-1].combination = args->combination;
      (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.ptr =
           pQVar5 + -1;
      i = lVar4;
      goto LAB_0040df38;
    }
  }
  iVar2 = args->combination;
  pqVar1 = &(this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>
            .size;
  bVar6 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
          size != 0;
  QArrayDataPointer<QKeyCombination>::detachAndGrow
            ((QArrayDataPointer<QKeyCombination> *)this,(uint)(i == 0 && bVar6),1,
             (QKeyCombination **)0x0,(QArrayDataPointer<QKeyCombination> *)0x0);
  pQVar5 = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
           ptr;
  if (i == 0 && bVar6) {
    pQVar5[-1].combination = iVar2;
    (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.ptr =
         pQVar5 + -1;
    i = (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.
        size;
  }
  else {
    memmove(pQVar5 + i + 1,pQVar5 + i,(*pqVar1 - i) * 4);
    pQVar5[i].combination = iVar2;
    i = *pqVar1;
  }
LAB_0040df38:
  (this->super_QGenericArrayOps<QKeyCombination>).super_QArrayDataPointer<QKeyCombination>.size =
       i + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }